

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O0

int lookup_opt_type(char *line)

{
  char *__s1;
  int iVar1;
  size_t __n;
  ulong local_20;
  size_t i;
  char *line_local;
  
  local_20 = 0;
  while( true ) {
    if (5 < local_20) {
      return -1;
    }
    __s1 = op_tbl[local_20].type_str;
    __n = strlen(op_tbl[local_20].type_str);
    iVar1 = strncmp(__s1,line,__n);
    if (iVar1 == 0) break;
    local_20 = local_20 + 1;
  }
  _mpp_log_l(4,0,"option type %s find\n",0,op_tbl[local_20].type_str);
  return op_tbl[local_20].type;
}

Assistant:

static int lookup_opt_type(char *line)
{
    size_t i;

    for (i = 0; i < ARRAY_SIZE(op_tbl); ++i) {
        if (!strncmp(op_tbl[i].type_str, line,
                     strlen(op_tbl[i].type_str))) {
            mpp_log("option type %s find\n", op_tbl[i].type_str);
            return op_tbl[i].type;
        }
    }

    return -1;
}